

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void mips_tr_tb_stop(DisasContextBase *dcbase,CPUState *cs)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  DisasContextBase *__mptr;
  DisasContext_conflict6 *ctx;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  tcg_ctx_00 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  if (((dcbase->singlestep_enabled & 1U) == 0) || (dcbase->is_jmp == DISAS_NORETURN)) {
    switch(dcbase->is_jmp) {
    case DISAS_NEXT:
    case DISAS_TOO_MANY:
      save_cpu_state((DisasContext_conflict6 *)dcbase,0);
      gen_goto_tb((DisasContext_conflict6 *)dcbase,0,dcbase->pc_next);
      break;
    case DISAS_NORETURN:
      break;
    case DISAS_TARGET_0:
      gen_save_pc(tcg_ctx_00,dcbase->pc_next);
      tcg_gen_lookup_and_goto_ptr_mips64el(tcg_ctx_00);
      break;
    case DISAS_TARGET_1:
      tcg_gen_exit_tb_mips64el(tcg_ctx_00,(TranslationBlock *)0x0,0);
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
                 ,0x7955,(char *)0x0);
    }
  }
  else {
    save_cpu_state((DisasContext_conflict6 *)dcbase,(uint)(dcbase->is_jmp != DISAS_TARGET_1));
    gen_helper_raise_exception_debug(tcg_ctx_00,tcg_ctx_00->cpu_env);
  }
  return;
}

Assistant:

static void mips_tr_tb_stop(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (ctx->base.singlestep_enabled && ctx->base.is_jmp != DISAS_NORETURN) {
        save_cpu_state(ctx, ctx->base.is_jmp != DISAS_EXIT);
        gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    } else {
        switch (ctx->base.is_jmp) {
        case DISAS_STOP:
            gen_save_pc(tcg_ctx, ctx->base.pc_next);
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            break;
        case DISAS_NEXT:
        case DISAS_TOO_MANY:
            save_cpu_state(ctx, 0);
            gen_goto_tb(ctx, 0, ctx->base.pc_next);
            break;
        case DISAS_EXIT:
            tcg_gen_exit_tb(tcg_ctx, NULL, 0);
            break;
        case DISAS_NORETURN:
            break;
        default:
            g_assert_not_reached();
        }
    }
}